

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl_sv.c
# Opt level: O0

dtl_error_t dtl_sv_lt(dtl_sv_t *self,dtl_sv_t *other,_Bool *result)

{
  dtl_sv_type_id dVar1;
  dtl_sv_type_id dVar2;
  int iVar3;
  int tmp;
  dtl_sv_type_id rightType;
  dtl_sv_type_id leftType;
  dtl_error_t retval;
  _Bool *result_local;
  dtl_sv_t *other_local;
  dtl_sv_t *self_local;
  
  if (((self == (dtl_sv_t *)0x0) || (other == (dtl_sv_t *)0x0)) || (result == (_Bool *)0x0)) {
    self_local._4_4_ = DTL_SV_I32;
  }
  else {
    rightType = DTL_SV_U64;
    *result = false;
    dVar1 = dtl_sv_type(self);
    dVar2 = dtl_sv_type(other);
    switch(dVar1) {
    case DTL_SV_NONE:
      rightType = DTL_SV_U64;
      break;
    case DTL_SV_I32:
      if (dVar2 == DTL_SV_I32) {
        *result = (self->pAny->val).i32 < (other->pAny->val).i32;
        rightType = DTL_SV_NONE;
      }
      break;
    case DTL_SV_U32:
      if (dVar2 == DTL_SV_U32) {
        *result = (self->pAny->val).u32 < (other->pAny->val).u32;
        rightType = DTL_SV_NONE;
      }
      break;
    case DTL_SV_I64:
      if (dVar2 == DTL_SV_I64) {
        *result = (self->pAny->val).i64 < (other->pAny->val).i64;
        rightType = DTL_SV_NONE;
      }
      break;
    case DTL_SV_U64:
      if (dVar2 == DTL_SV_U64) {
        *result = (self->pAny->val).u64 < (other->pAny->val).u64;
        rightType = DTL_SV_NONE;
      }
      break;
    case DTL_SV_FLT:
      if (dVar2 == DTL_SV_FLT) {
        *result = (self->pAny->val).flt < (other->pAny->val).flt;
        rightType = DTL_SV_NONE;
      }
      break;
    case DTL_SV_DBL:
      if (dVar2 == DTL_SV_DBL) {
        *result = (self->pAny->val).dbl < (other->pAny->val).dbl;
        rightType = DTL_SV_NONE;
      }
      break;
    default:
      rightType = DTL_SV_U64;
      break;
    case DTL_SV_BOOL:
      if (dVar2 == DTL_SV_BOOL) {
        *result = ((self->pAny->val).cr & 1U) < ((other->pAny->val).cr & 1U);
        rightType = DTL_SV_NONE;
      }
      break;
    case DTL_SV_STR:
      if ((dVar2 == DTL_SV_STR) &&
         (iVar3 = adt_str_lt((self->pAny->val).i64,(other->pAny->val).i64), -1 < iVar3)) {
        *result = iVar3 != 0;
        rightType = DTL_SV_NONE;
      }
      break;
    case DTL_SV_PTR:
      break;
    case DTL_SV_DV:
    }
    self_local._4_4_ = rightType;
  }
  return self_local._4_4_;
}

Assistant:

dtl_error_t dtl_sv_lt(const dtl_sv_t *self, const dtl_sv_t *other, bool *result)
{
   if ( (self != 0) && (other != 0) && (result != 0) )
   {
      dtl_error_t retval = DTL_TYPE_ERROR;
      dtl_sv_type_id leftType, rightType;
      *result = false;
      leftType = dtl_sv_type(self);
      rightType = dtl_sv_type(other);
      switch(leftType)
      {
      case DTL_SV_NONE:
         retval = DTL_TYPE_ERROR; //cannot compare if None is less than None
         break;
      case DTL_SV_I32:
         if (rightType == DTL_SV_I32)
         {
            *result = self->pAny->val.i32 < other->pAny->val.i32;
            retval = DTL_NO_ERROR;
         }
         break;
      case DTL_SV_U32:
         if (rightType == DTL_SV_U32)
         {
            *result = self->pAny->val.u32 < other->pAny->val.u32;
            retval = DTL_NO_ERROR;
         }
         break;
      case DTL_SV_I64:
         if (rightType == DTL_SV_I64)
         {
            *result = self->pAny->val.i64 < other->pAny->val.i64;
            retval = DTL_NO_ERROR;
         }
         break;
      case DTL_SV_U64:
         if (rightType == DTL_SV_U64)
         {
            *result = self->pAny->val.u64 < other->pAny->val.u64;
            retval = DTL_NO_ERROR;
         }
         break;
      case DTL_SV_FLT:
         if (rightType == DTL_SV_FLT)
         {
            *result = self->pAny->val.flt < other->pAny->val.flt;
            retval = DTL_NO_ERROR;
         }
         break;
      case DTL_SV_DBL:
         if (rightType == DTL_SV_DBL)
         {
            *result = self->pAny->val.dbl < other->pAny->val.dbl;
            retval = DTL_NO_ERROR;
         }
         break;
      case DTL_SV_BOOL:
         if (rightType == DTL_SV_BOOL)
         {
            *result = self->pAny->val.bl < other->pAny->val.bl;
            retval = DTL_NO_ERROR;
         }
         break;
      case DTL_SV_STR:
         if (rightType == DTL_SV_STR)
         {
            int tmp = adt_str_lt(self->pAny->val.str, other->pAny->val.str);
            if (tmp >= 0)
            {
               *result = (bool) tmp;
               retval = DTL_NO_ERROR;
            }
         }
         break;
      case DTL_SV_PTR:
         break;
      case DTL_SV_DV:
         break;
      default:
         retval = DTL_TYPE_ERROR;
      }
      return retval;
   }
   return DTL_INVALID_ARGUMENT_ERROR;
}